

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator|
          (CharClass<char> *__return_storage_ptr__,CharClass<char> *this,Range<char> *r)

{
  __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
  __first;
  bool bVar1;
  pointer pRVar2;
  const_iterator __last;
  bool local_f9;
  byte local_e1;
  __normal_iterator<Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
  local_a8;
  const_iterator local_a0;
  Range<char> *local_98;
  Range<char> local_90;
  __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
  local_80;
  Range<char> *local_78;
  Range<char> *local_70;
  Range<char> *local_68;
  __normal_iterator<Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
  local_60;
  const_iterator local_58;
  Range<char> *local_50;
  __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
  local_38;
  __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
  local_30;
  const_iterator i;
  Range<char> *r_local;
  CharClass<char> *this_local;
  CharClass<char> *cc;
  
  i._M_current._7_1_ = 0;
  CharClass(__return_storage_ptr__);
  local_30._M_current =
       (Range<char> *)
       std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::cbegin
                 (&this->m_ranges);
  while( true ) {
    local_38._M_current =
         (Range<char> *)
         std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::cend
                   (&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    local_e1 = 0;
    if (bVar1) {
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
               ::operator->(&local_30);
      bVar1 = Range<char>::overlaps(pRVar2,r);
      local_e1 = bVar1 ^ 0xff;
    }
    if ((local_e1 & 1) == 0) break;
    local_50 = (Range<char> *)
               __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
               ::operator++(&local_30,0);
  }
  local_60._M_current =
       (Range<char> *)
       std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::end
                 (&__return_storage_ptr__->m_ranges);
  __gnu_cxx::
  __normal_iterator<Centaurus::Range<char>const*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>
  ::__normal_iterator<Centaurus::Range<char>*>
            ((__normal_iterator<Centaurus::Range<char>const*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>
              *)&local_58,&local_60);
  local_68 = (Range<char> *)
             std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::cbegin
                       (&this->m_ranges);
  local_70 = local_30._M_current;
  local_78 = (Range<char> *)
             std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
             insert<__gnu_cxx::__normal_iterator<Centaurus::Range<char>const*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>,void>
                       ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)
                        &__return_storage_ptr__->m_ranges,local_58,
                        (__normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
                         )local_68,local_30);
  while( true ) {
    local_80._M_current =
         (Range<char> *)
         std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::cend
                   (&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_80);
    local_f9 = false;
    if (bVar1) {
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
               ::operator->(&local_30);
      local_f9 = Range<char>::overlaps(pRVar2,r);
    }
    if (local_f9 == false) break;
    __gnu_cxx::
    __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
    ::operator*(&local_30);
    Range<char>::merge(&local_90,r);
    Range<char>::operator=(r,&local_90);
    Range<char>::~Range(&local_90);
    local_98 = (Range<char> *)
               __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
               ::operator++(&local_30,0);
  }
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::push_back
            (&__return_storage_ptr__->m_ranges,r);
  local_a8._M_current =
       (Range<char> *)
       std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::end
                 (&__return_storage_ptr__->m_ranges);
  __gnu_cxx::
  __normal_iterator<Centaurus::Range<char>const*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>
  ::__normal_iterator<Centaurus::Range<char>*>
            ((__normal_iterator<Centaurus::Range<char>const*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>
              *)&local_a0,&local_a8);
  __first._M_current = local_30._M_current;
  __last = std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::cend
                     (&this->m_ranges);
  std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
  insert<__gnu_cxx::__normal_iterator<Centaurus::Range<char>const*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>,void>
            ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)
             &__return_storage_ptr__->m_ranges,local_a0,__first,
             (__normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
              )__last._M_current);
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator|(Range<TCHAR> r) const
    {
        CharClass<TCHAR> cc;

        auto i = m_ranges.cbegin();

        for (; i != m_ranges.cend() && !i->overlaps(r); i++)
            ;
        
        cc.m_ranges.insert(cc.m_ranges.end(), m_ranges.cbegin(), i);

        for (; i != m_ranges.cend() && i->overlaps(r); i++)
        {
            r = r.merge(*i);
        }

        cc.m_ranges.push_back(r);

        cc.m_ranges.insert(cc.m_ranges.end(), i, m_ranges.cend());

        return cc;
    }